

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O2

void Js::AsmJsByteCodeDumper::
     DumpElementSlot<Js::OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCodeAsmJs op,OpLayoutT_ElementSlot<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data
               ,FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  ushort uVar1;
  uint uVar2;
  WasmReaderInfo *pWVar3;
  WebAssemblyModule *pWVar4;
  code *pcVar5;
  bool bVar6;
  uint32 uVar7;
  int iVar8;
  AsmJsFunctionInfo *pAVar9;
  WasmFunctionInfo *pWVar10;
  undefined4 extraout_var;
  undefined4 *puVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  undefined6 in_register_0000003a;
  char16_t *form;
  
  iVar8 = (int)CONCAT62(in_register_0000003a,op);
  switch(iVar8) {
  case 0x4d:
  case 0x4e:
    pAVar9 = FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)2,Js::AsmJsFunctionInfo*>
                       ((FunctionProxy *)dumpFunction);
    pWVar3 = (pAVar9->mWasmReaderInfo).ptr;
    if ((pWVar3 != (WasmReaderInfo *)0x0) &&
       (uVar1 = data->SlotIndex, pWVar4 = (pWVar3->m_module).ptr,
       uVar2 = pWVar4->m_importedFunctionCount,
       uVar7 = WebAssemblyModule::GetWasmFunctionCount(pWVar4), ~uVar2 + (uint)uVar1 < uVar7)) {
      pWVar4 = (pWVar3->m_module).ptr;
      pWVar10 = WebAssemblyModule::GetWasmFunctionInfo
                          (pWVar4,~pWVar4->m_importedFunctionCount + (uint)data->SlotIndex);
      uVar1 = data->Value;
      iVar8 = (*(((pWVar10->m_body).ptr)->super_ParseableFunctionInfo).super_FunctionProxy.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7]
              )();
      Output::Print(L" R%d = %s",(ulong)uVar1,CONCAT44(extraout_var,iVar8));
      return;
    }
    uVar14 = (ulong)data->Value;
    uVar13 = (ulong)data->Instance;
    uVar12 = (ulong)data->SlotIndex;
    form = L" R%d = R%d[%d]";
    break;
  case 0x4f:
    uVar14 = (ulong)data->Value;
    uVar13 = (ulong)data->Instance;
    uVar12 = (ulong)data->SlotIndex;
    form = L" D%d = R%d[%d]";
    break;
  case 0x50:
    uVar14 = (ulong)data->Value;
    uVar13 = (ulong)data->Instance;
    uVar12 = (ulong)data->SlotIndex;
    form = L" I%d = R%d[%d]";
    break;
  case 0x51:
    uVar14 = (ulong)data->Value;
    uVar13 = (ulong)data->Instance;
    uVar12 = (ulong)data->SlotIndex;
    form = L" L%d = R%d[%d]";
    break;
  case 0x52:
    uVar14 = (ulong)data->Value;
    uVar13 = (ulong)data->Instance;
    uVar12 = (ulong)data->SlotIndex;
    form = L" F%d = R%d[%d]";
    break;
  case 0x53:
    uVar14 = (ulong)data->Instance;
    uVar13 = (ulong)data->SlotIndex;
    uVar12 = (ulong)data->Value;
    form = L" R%d[%d] = D%d";
    break;
  case 0x54:
    uVar14 = (ulong)data->Instance;
    uVar13 = (ulong)data->SlotIndex;
    uVar12 = (ulong)data->Value;
    form = L" R%d[%d] = I%d";
    break;
  case 0x55:
    uVar14 = (ulong)data->Instance;
    uVar13 = (ulong)data->SlotIndex;
    uVar12 = (ulong)data->Value;
    form = L" R%d[%d] = L%d";
    break;
  case 0x56:
    uVar14 = (ulong)data->Instance;
    uVar13 = (ulong)data->SlotIndex;
    uVar12 = (ulong)data->Value;
    form = L" R%d[%d] = F%d";
    break;
  case 0x57:
  case 0x58:
    uVar14 = (ulong)data->Value;
    uVar13 = (ulong)data->Instance;
    uVar12 = (ulong)data->SlotIndex;
    form = L" R%d = R%d[I%d]";
    break;
  default:
    switch(iVar8) {
    case 0x18c:
      uVar14 = (ulong)data->Instance;
      uVar13 = (ulong)data->SlotIndex;
      uVar12 = (ulong)data->Value;
      form = L" R%d[%d]  = I8_%d";
      break;
    case 0x18d:
      uVar14 = (ulong)data->Value;
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      form = L" U4_%d = R%d[%d]";
      break;
    case 0x18e:
      uVar14 = (ulong)data->Instance;
      uVar13 = (ulong)data->SlotIndex;
      uVar12 = (ulong)data->Value;
      form = L" R%d[%d]  = U4_%d";
      break;
    case 399:
      uVar14 = (ulong)data->Value;
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      form = L" U8_%d = R%d[%d]";
      break;
    case 400:
      uVar14 = (ulong)data->Instance;
      uVar13 = (ulong)data->SlotIndex;
      uVar12 = (ulong)data->Value;
      form = L" R%d[%d]  = U8_%d";
      break;
    case 0x191:
      uVar14 = (ulong)data->Value;
      uVar13 = (ulong)data->Instance;
      uVar12 = (ulong)data->SlotIndex;
      form = L" U16_%d = R%d[%d]";
      break;
    case 0x192:
      uVar14 = (ulong)data->Instance;
      uVar13 = (ulong)data->SlotIndex;
      uVar12 = (ulong)data->Value;
      form = L" R%d[%d]  = U16_%d";
      break;
    default:
      if (iVar8 == 0xed) {
        uVar14 = (ulong)data->Value;
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        form = L" I4_%d = R%d[%d]";
      }
      else if (iVar8 == 0xee) {
        uVar14 = (ulong)data->Instance;
        uVar13 = (ulong)data->SlotIndex;
        uVar12 = (ulong)data->Value;
        form = L" R%d[%d]  = I4_%d";
      }
      else if (iVar8 == 0xf3) {
        uVar14 = (ulong)data->Value;
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        form = L" I8_%d = R%d[%d]";
      }
      else if (iVar8 == 0xf7) {
        uVar14 = (ulong)data->Value;
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        form = L" I16_%d = R%d[%d]";
      }
      else if (iVar8 == 0x141) {
        uVar14 = (ulong)data->Value;
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        form = L" F4_%d = R%d[%d]";
      }
      else if (iVar8 == 0x142) {
        uVar14 = (ulong)data->Instance;
        uVar13 = (ulong)data->SlotIndex;
        uVar12 = (ulong)data->Value;
        form = L" R%d[%d]  = F4_%d";
      }
      else if (iVar8 == 0x1e5) {
        uVar14 = (ulong)data->Instance;
        uVar13 = (ulong)data->SlotIndex;
        uVar12 = (ulong)data->Value;
        form = L" R%d[%d]  = I16_%d";
      }
      else if (iVar8 == 0x259) {
        uVar14 = (ulong)data->Value;
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        form = L" B4_%d = R%d[%d]";
      }
      else if (iVar8 == 0x25a) {
        uVar14 = (ulong)data->Instance;
        uVar13 = (ulong)data->SlotIndex;
        uVar12 = (ulong)data->Value;
        form = L" R%d[%d]  = B4_%d";
      }
      else if (iVar8 == 0x266) {
        uVar14 = (ulong)data->Value;
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        form = L" B8_%d = R%d[%d]";
      }
      else if (iVar8 == 0x267) {
        uVar14 = (ulong)data->Instance;
        uVar13 = (ulong)data->SlotIndex;
        uVar12 = (ulong)data->Value;
        form = L" R%d[%d]  = B8_%d";
      }
      else if (iVar8 == 0x26f) {
        uVar14 = (ulong)data->Value;
        uVar13 = (ulong)data->Instance;
        uVar12 = (ulong)data->SlotIndex;
        form = L" B16_%d = R%d[%d]";
      }
      else {
        if (iVar8 != 0x270) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar11 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                      ,0x1fe,"(false)","Unknown OpCode for OpLayoutElementSlot");
          if (!bVar6) {
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar11 = 0;
          return;
        }
        uVar14 = (ulong)data->Instance;
        uVar13 = (ulong)data->SlotIndex;
        uVar12 = (ulong)data->Value;
        form = L" R%d[%d]  = B16_%d";
      }
    }
  }
  Output::Print(form,uVar14,uVar13,uVar12);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpElementSlot(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
        case OpCodeAsmJs::LdSlot:
        case OpCodeAsmJs::LdSlotArr:
        {
#ifdef ENABLE_WASM
            auto asmInfo = dumpFunction->GetAsmJsFunctionInfo();
            auto wasmInfo = asmInfo->GetWasmReaderInfo();
            if (wasmInfo)
            {
                uint index = (uint)data->SlotIndex;
                if (index - wasmInfo->m_module->GetFuncOffset() < wasmInfo->m_module->GetWasmFunctionCount())
                {
                    uint funcIndex = data->SlotIndex - wasmInfo->m_module->GetFuncOffset();
                    auto loadedFunc = wasmInfo->m_module->GetWasmFunctionInfo(funcIndex);
                    Output::Print(_u(" R%d = %s"), data->Value, loadedFunc->GetBody()->GetDisplayName());
                    break;
                }
            }
#endif
            Output::Print(_u(" R%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        }
        case OpCodeAsmJs::LdArr_Func:
        case OpCodeAsmJs::LdArr_WasmFunc:
            Output::Print(_u(" R%d = R%d[I%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::StSlot_Int:
            Output::Print(_u(" R%d[%d] = I%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::StSlot_Long:
            Output::Print(_u(" R%d[%d] = L%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::StSlot_Flt:
            Output::Print(_u(" R%d[%d] = F%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::StSlot_Db:
            Output::Print(_u(" R%d[%d] = D%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::LdSlot_Int:
            Output::Print(_u(" I%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::LdSlot_Long:
            Output::Print(_u(" L%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::LdSlot_Flt:
            Output::Print(_u(" F%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::LdSlot_Db:
            Output::Print(_u(" D%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_F4:
            Output::Print(_u(" F4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_I4:
            Output::Print(_u(" I4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_I8:
            Output::Print(_u(" I8_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_I16:
            Output::Print(_u(" I16_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_U4:
            Output::Print(_u(" U4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_U8:
            Output::Print(_u(" U8_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_U16:
            Output::Print(_u(" U16_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_B4:
            Output::Print(_u(" B4_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_B8:
            Output::Print(_u(" B8_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
        case OpCodeAsmJs::Simd128_LdSlot_B16:
            Output::Print(_u(" B16_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;
#if 0
        case OpCodeAsmJs::Simd128_LdSlot_D2:
            Output::Print(_u(" D2_%d = R%d[%d]"), data->Value, data->Instance, data->SlotIndex);
            break;

#endif // 0

        case OpCodeAsmJs::Simd128_StSlot_F4:
            Output::Print(_u(" R%d[%d]  = F4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_I4:
            Output::Print(_u(" R%d[%d]  = I4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_I8:
            Output::Print(_u(" R%d[%d]  = I8_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_I16:
            Output::Print(_u(" R%d[%d]  = I16_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_U4:
            Output::Print(_u(" R%d[%d]  = U4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_U8:
            Output::Print(_u(" R%d[%d]  = U8_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_U16:
            Output::Print(_u(" R%d[%d]  = U16_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_B4:
            Output::Print(_u(" R%d[%d]  = B4_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_B8:
            Output::Print(_u(" R%d[%d]  = B8_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
        case OpCodeAsmJs::Simd128_StSlot_B16:
            Output::Print(_u(" R%d[%d]  = B16_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
#if 0
        case OpCodeAsmJs::Simd128_StSlot_D2:
            Output::Print(_u(" R%d[%d]  = D2_%d"), data->Instance, data->SlotIndex, data->Value);
            break;
#endif // 0

        default:
        {
            AssertMsg(false, "Unknown OpCode for OpLayoutElementSlot");
            break;
        }
        }
    }